

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

bool __thiscall HEkk::getNonsingularInverse(HEkk *this,HighsInt solve_phase)

{
  HighsSimplexAnalysis *this_00;
  HighsHashTable<unsigned_long,_void> *this_01;
  uint uVar1;
  uint uVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer pdVar5;
  bool bVar6;
  uint uVar7;
  HighsInt HVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t deficient_hash;
  vector<int,_std::allocator<int>_> basicIndex_before_compute_factor;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&basicIndex_before_compute_factor,&(this->basis_).basicIndex_);
  uVar1 = (this->info_).update_count;
  this_00 = &this->analysis_;
  uVar10 = 0;
  HighsSimplexAnalysis::simplexTimerStart(this_00,0x1c,0);
  uVar7 = (this->lp_).num_row_;
  pdVar3 = (this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->scattered_dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar9 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar9 = uVar10;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    pdVar5[piVar4[uVar10]] = pdVar3[uVar10];
  }
  HighsSimplexAnalysis::simplexTimerStop(this_00,0x1c,0);
  uVar7 = computeFactor(this);
  if (uVar7 == 0) {
    putBacktrackingBasis(this,&basicIndex_before_compute_factor);
    (this->info_).backtracking_ = false;
    (this->info_).update_limit = (this->options_->super_HighsOptionsStruct).simplex_update_limit;
LAB_0032e0b9:
    uVar10 = 0;
    HighsSimplexAnalysis::simplexTimerStart(this_00,0x1c,0);
    uVar1 = (this->lp_).num_row_;
    piVar4 = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->scattered_dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar5 = (this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      pdVar5[uVar10] = pdVar3[piVar4[uVar10]];
    }
    bVar6 = true;
    HighsSimplexAnalysis::simplexTimerStop(this_00,0x1c,0);
  }
  else {
    highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                "HEkk::getNonsingularInverse Rank_deficiency: solve %d (Iteration %d)\n",
                (ulong)(uint)this->debug_solve_call_num_,(ulong)(uint)this->iteration_count_);
    deficient_hash = (this->basis_).hash;
    bVar6 = getBacktrackingBasis(this);
    if (bVar6) {
      (this->info_).backtracking_ = true;
      this_01 = &this->visited_basis_;
      HighsHashTable<unsigned_long,_void>::clear(this_01);
      HighsHashTable<unsigned_long,void>::insert<unsigned_long&>
                ((HighsHashTable<unsigned_long,void> *)this_01,&(this->basis_).hash);
      HighsHashTable<unsigned_long,void>::insert<unsigned_long&>
                ((HighsHashTable<unsigned_long,void> *)this_01,&deficient_hash);
      (this->status_).has_ar_matrix = false;
      (this->status_).has_fresh_rebuild = false;
      (this->status_).has_dual_objective_value = false;
      (this->status_).has_primal_objective_value = false;
      HVar8 = computeFactor(this);
      if (1 < (int)uVar1 && HVar8 == 0) {
        uVar2 = (this->info_).update_limit;
        (this->info_).update_limit = uVar1 >> 1;
        highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kWarning,
                    "Rank deficiency of %d after %d simplex updates, so backtracking: max updates reduced from %d to %d\n"
                    ,(ulong)uVar7,(ulong)uVar1,(ulong)uVar2,uVar1 >> 1);
        goto LAB_0032e0b9;
      }
    }
    bVar6 = false;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&basicIndex_before_compute_factor.super__Vector_base<int,_std::allocator<int>_>);
  return bVar6;
}

Assistant:

bool HEkk::getNonsingularInverse(const HighsInt solve_phase) {
  assert(status_.has_basis);
  const vector<HighsInt>& basicIndex = basis_.basicIndex_;
  // Take a copy of basicIndex from before INVERT to be used as the
  // saved ordering of basic variables - so reinvert will run
  // identically.
  const vector<HighsInt> basicIndex_before_compute_factor = basicIndex;
  // Save the number of updates performed in case it has to be used to determine
  // a limit
  const HighsInt simplex_update_count = info_.update_count;
  // Dual simplex edge weights are identified with rows, so must be
  // permuted according to INVERT. Scatter the edge weights so that,
  // after INVERT, they can be gathered according to the new
  // permutation of basicIndex
  analysis_.simplexTimerStart(PermWtClock);
  for (HighsInt i = 0; i < lp_.num_row_; i++)
    scattered_dual_edge_weight_[basicIndex[i]] = dual_edge_weight_[i];
  analysis_.simplexTimerStop(PermWtClock);

  // Call computeFactor to perform INVERT
  HighsInt rank_deficiency = computeFactor();
  if (rank_deficiency)
    highsLogDev(
        options_->log_options, HighsLogType::kInfo,
        "HEkk::getNonsingularInverse Rank_deficiency: solve %d (Iteration "
        "%d)\n",
        (int)debug_solve_call_num_, (int)iteration_count_);

  const bool artificial_rank_deficiency = false;  //  true;//
  if (artificial_rank_deficiency) {
    if (!info_.phase1_backtracking_test_done && solve_phase == kSolvePhase1) {
      // Claim rank deficiency to test backtracking
      // printf("Phase1 (Iter %" HIGHSINT_FORMAT
      //        ") Claiming rank deficiency to test backtracking\n",
      //        iteration_count_);
      rank_deficiency = 1;
      info_.phase1_backtracking_test_done = true;
    } else if (!info_.phase2_backtracking_test_done &&
               solve_phase == kSolvePhase2) {
      // Claim rank deficiency to test backtracking
      // printf("Phase2 (Iter %" HIGHSINT_FORMAT
      //        ") Claiming rank deficiency to test backtracking\n",
      //        iteration_count_);
      rank_deficiency = 1;
      info_.phase2_backtracking_test_done = true;
    }
  }
  if (rank_deficiency) {
    // Rank deficient basis, so backtrack to last full rank basis
    //
    // Get the last nonsingular basis - so long as there is one
    uint64_t deficient_hash = basis_.hash;
    if (!getBacktrackingBasis()) return false;
    // Record that backtracking is taking place
    info_.backtracking_ = true;
    visited_basis_.clear();
    visited_basis_.insert(basis_.hash);
    visited_basis_.insert(deficient_hash);
    this->updateStatus(LpAction::kBacktracking);
    HighsInt backtrack_rank_deficiency = computeFactor();
    // This basis has previously been inverted successfully, so it shouldn't be
    // singular
    if (backtrack_rank_deficiency) return false;
    // simplex update limit will be half of the number of updates
    // performed, so make sure that at least one update was performed
    if (simplex_update_count <= 1) return false;
    HighsInt use_simplex_update_limit = info_.update_limit;
    HighsInt new_simplex_update_limit = simplex_update_count / 2;
    info_.update_limit = new_simplex_update_limit;
    highsLogDev(options_->log_options, HighsLogType::kWarning,
                "Rank deficiency of %" HIGHSINT_FORMAT
                " after %" HIGHSINT_FORMAT
                " simplex updates, so "
                "backtracking: max updates reduced from %" HIGHSINT_FORMAT
                " to %" HIGHSINT_FORMAT "\n",
                rank_deficiency, simplex_update_count, use_simplex_update_limit,
                new_simplex_update_limit);
  } else {
    // Current basis is full rank so save it
    putBacktrackingBasis(basicIndex_before_compute_factor);
    // Indicate that backtracking is not taking place
    info_.backtracking_ = false;
    // Reset the update limit in case this is the first successful
    // inversion after backtracking
    info_.update_limit = options_->simplex_update_limit;
  }
  // Gather the edge weights according to the permutation of
  // basicIndex after INVERT
  analysis_.simplexTimerStart(PermWtClock);
  for (HighsInt i = 0; i < lp_.num_row_; i++)
    dual_edge_weight_[i] = scattered_dual_edge_weight_[basicIndex[i]];
  analysis_.simplexTimerStop(PermWtClock);
  return true;
}